

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O0

int lj_cf_debug_setmetatable(lua_State *L)

{
  long in_RDI;
  lua_State *in_stack_00000008;
  int in_stack_0000002c;
  lua_State *in_stack_00000030;
  
  lj_lib_checktabornil(in_stack_00000008,L._4_4_);
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x10) + 0x10;
  lua_setmetatable(in_stack_00000030,in_stack_0000002c);
  *(undefined4 *)(*(long *)(in_RDI + 0x18) + -4) = 0xfffffffd;
  return 1;
}

Assistant:

LJLIB_CF(debug_setmetatable)
{
  lj_lib_checktabornil(L, 2);
  L->top = L->base+2;
  lua_setmetatable(L, 1);
#if !LJ_52
  setboolV(L->top-1, 1);
#endif
  return 1;
}